

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  Vec_Int_t *vFirst;
  int *piVar5;
  Vec_Int_t *vCount;
  int *piVar6;
  Vec_Int_t *vOrder;
  Vec_Int_t *vVisit;
  int iVar7;
  int **ppiVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  
  if ((long)vCubes->nSize < 1) {
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = 0xffffffff;
    lVar11 = 0;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar11) < 1) goto LAB_0070e567;
      uVar1 = **(uint **)((long)&vCubes->pArray->pArray + lVar11);
      if ((int)uVar10 <= (int)uVar1) {
        uVar10 = uVar1;
      }
      lVar11 = lVar11 + 0x10;
    } while ((long)vCubes->nSize * 0x10 != lVar11);
  }
  uVar1 = uVar10 + 1;
  if (uVar1 == nStart) {
    vOrder = (Vec_Int_t *)0x0;
  }
  else {
    vFirst = (Vec_Int_t *)malloc(0x10);
    uVar12 = 0x10;
    if (0xe < uVar10) {
      uVar12 = uVar1;
    }
    vFirst->nSize = 0;
    vFirst->nCap = uVar12;
    uVar9 = (ulong)uVar12;
    if (uVar12 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc(uVar9 * 4);
    }
    vFirst->pArray = piVar5;
    vFirst->nSize = uVar1;
    uVar13 = (ulong)uVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,uVar13 * 4);
    }
    vCount = (Vec_Int_t *)malloc(0x10);
    vCount->nSize = 0;
    vCount->nCap = uVar12;
    if (uVar12 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc(uVar9 * 4);
    }
    vCount->pArray = piVar6;
    vCount->nSize = uVar1;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,uVar13 * 4);
    }
    iVar7 = vCubes->nSize;
    if (0 < (long)iVar7) {
      ppiVar8 = &vCubes->pArray->pArray;
      lVar11 = 0;
      do {
        if (*(int *)((long)ppiVar8 + -4) < 1) goto LAB_0070e567;
        uVar2 = **ppiVar8;
        if ((int)uVar2 < nInputs) {
          __assert_fail("iFanin >= nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaFx.c"
                        ,0x126,
                        "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                       );
        }
        if (((int)uVar2 < 0) || (vCount->nSize <= (int)uVar2)) goto LAB_0070e567;
        iVar3 = piVar6[uVar2];
        if (iVar3 == 0) {
          if (vFirst->nSize <= (int)uVar2) goto LAB_0070e586;
          piVar5[uVar2] = (int)lVar11;
        }
        piVar6[uVar2] = iVar3 + 1;
        lVar11 = lVar11 + 1;
        ppiVar8 = ppiVar8 + 2;
      } while (iVar7 != lVar11);
    }
    vOrder = (Vec_Int_t *)malloc(0x10);
    iVar7 = 0x10;
    if (0xe < nInputs - 1U) {
      iVar7 = nInputs;
    }
    vOrder->nSize = 0;
    vOrder->nCap = iVar7;
    if (iVar7 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar7 << 2);
    }
    vOrder->pArray = piVar5;
    vOrder->nSize = nInputs;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,(long)nInputs << 2);
    }
    vVisit = (Vec_Int_t *)malloc(0x10);
    vVisit->nSize = 0;
    vVisit->nCap = uVar12;
    if (uVar12 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc(uVar9 << 2);
    }
    vVisit->pArray = piVar5;
    vVisit->nSize = uVar1;
    if (piVar5 != (int *)0x0) {
      memset(piVar5,0,uVar13 << 2);
    }
    if (0 < nInputs) {
      uVar12 = 0xffffffff;
      if (-1 < (int)uVar10) {
        uVar12 = uVar10;
      }
      uVar9 = 0;
      do {
        if (uVar12 + 1 == uVar9) {
LAB_0070e586:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar5[uVar9] = 1;
        uVar9 = uVar9 + 1;
      } while ((uint)nInputs != uVar9);
    }
    if (nInputs <= (int)uVar10) {
      piVar6 = piVar5 + (uint)nInputs;
      iVar7 = nInputs;
      do {
        if (nInputs < 0) {
LAB_0070e567:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*piVar6 == 0) {
          Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,vVisit,vOrder,iVar7);
        }
        piVar6 = piVar6 + 1;
        bVar4 = iVar7 < (int)uVar10;
        iVar7 = iVar7 + 1;
      } while (bVar4);
    }
    if (vOrder->nSize != uVar1) {
      __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaFx.c"
                    ,0x133,
                    "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                   );
    }
    if (piVar5 != (int *)0x0) {
      free(piVar5);
      vVisit->pArray = (int *)0x0;
    }
    free(vVisit);
    *pvFirst = vFirst;
    *pvCount = vCount;
  }
  return vOrder;
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}